

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O1

bool rtosc::validate<1,char_const*>(char *arg)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  
  bVar1 = rtosc_type(arg,1);
  if ((bVar1 & 0xdf) == 0x53) {
    uVar2 = rtosc_narguments(arg);
    bVar3 = uVar2 == 2;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}